

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::CheckProgram(DrawIndirectBase *this,GLuint program)

{
  void *pvVar1;
  CallLogWrapper *this_00;
  long lVar2;
  bool bVar3;
  GLint length_1;
  GLint attached_shaders;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  GLint length;
  GLenum type;
  GLint progStatus;
  DIResult status;
  char local_381;
  int local_380;
  int local_37c;
  vector<char,_std::allocator<char>_> local_378;
  vector<char,_std::allocator<char>_> local_360;
  GLuint local_344;
  int local_340;
  int local_33c;
  undefined1 local_338 [8];
  ostream local_330;
  undefined1 local_1b8 [384];
  long local_38;
  
  local_1b8[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
  local_38 = 0;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_33c);
  if (local_33c == 0) {
    local_38 = -1;
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,(char (*) [24])"GL_LINK_STATUS is false");
    DILogger::~DILogger((DILogger *)local_338);
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b85,&local_37c);
    if (0 < (long)local_37c) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_378,(long)local_37c,
                 (allocator_type *)local_338);
      local_344 = program;
      glu::CallLogWrapper::glGetAttachedShaders
                (this_00,program,local_37c,(GLsizei *)0x0,
                 (GLuint *)
                 local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (0 < local_37c) {
        lVar2 = 0;
        do {
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_378.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b4f,
                     &local_340);
          if (local_340 == 0x8b30) {
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            if (local_338[0] == (DILogger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_330,"*** Fragment Shader ***\n",0x18);
            }
          }
          else if (local_340 == 0x8b31) {
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            if (local_338[0] == (DILogger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_330,"*** Vertex Shader ***\n",0x16);
            }
          }
          else if (local_340 == 0x91b9) {
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)local_338,(char (*) [24])"*** Compute Shader ***\n");
          }
          else {
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)local_338,(char (*) [24])"*** Unknown Shader ***\n");
          }
          DILogger::~DILogger((DILogger *)local_338);
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_378.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b88,
                     &local_380);
          if (0 < (long)local_380) {
            std::vector<char,_std::allocator<char>_>::vector
                      (&local_360,(long)local_380,(allocator_type *)local_338);
            glu::CallLogWrapper::glGetShaderSource
                      (this_00,*(GLuint *)
                                ((long)local_378.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                       local_380,(GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_360.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_360.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            if (local_338[0] == (DILogger)0x0) {
              local_381 = *(char *)CONCAT44(local_360.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_start._4_4_,
                                            (int)local_360.
                                                 super__Vector_base<char,_std::allocator<char>_>.
                                                 _M_impl.super__Vector_impl_data._M_start);
              std::__ostream_insert<char,std::char_traits<char>>(&local_330,&local_381,1);
            }
            DILogger::~DILogger((DILogger *)local_338);
            pvVar1 = (void *)CONCAT44(local_360.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_360.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_360.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar1);
            }
          }
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_378.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b84,
                     &local_380);
          if (0 < (long)local_380) {
            std::vector<char,_std::allocator<char>_>::vector
                      (&local_360,(long)local_380,(allocator_type *)local_338);
            glu::CallLogWrapper::glGetShaderInfoLog
                      (this_00,*(GLuint *)
                                ((long)local_378.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                       local_380,(GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_360.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_360.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)local_338,
                       (char **)CONCAT44(local_360.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_360.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start));
            DILogger::~DILogger((DILogger *)local_338);
            pvVar1 = (void *)CONCAT44(local_360.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_360.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_360.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar1);
            }
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < local_37c);
      }
      program = local_344;
      if ((char **)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start != (char **)0x0) {
        operator_delete(local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        program = local_344;
      }
    }
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,(GLint *)&local_360);
    if (0 < (long)(int)local_360.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) {
      std::vector<char,_std::allocator<char>_>::vector
                (&local_378,
                 (long)(int)local_360.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,(allocator_type *)local_338);
      glu::CallLogWrapper::glGetProgramInfoLog
                (this_00,program,
                 (int)local_360.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(GLsizei *)0x0,
                 local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      local_38 = -1;
      local_338[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,
                 (char **)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      DILogger::~DILogger((DILogger *)local_338);
      if ((char **)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start != (char **)0x0) {
        operator_delete(local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  bVar3 = local_38 == 0;
  DILogger::~DILogger((DILogger *)local_1b8);
  return (ulong)bVar3;
}

Assistant:

long CheckProgram(GLuint program)
	{
		DIResult status;
		GLint	progStatus;
		glGetProgramiv(program, GL_LINK_STATUS, &progStatus);

		if (progStatus == GL_FALSE)
		{

			status.error() << "GL_LINK_STATUS is false";

			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					// shader type
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						status.error() << "*** Vertex Shader ***\n";
						break;
					case GL_FRAGMENT_SHADER:
						status.error() << "*** Fragment Shader ***\n";
						break;
					case GL_COMPUTE_SHADER:
						status.error() << "*** Compute Shader ***\n";
						break;
					default:
						status.error() << "*** Unknown Shader ***\n";
						break;
					}

					// shader source
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						status.error() << source[0];
					}

					// shader info log
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						status.error() << &log[0];
					}
				}
			}

			// program info log
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				status.error() << &log[0];
			}
		}

		return status.code() == NO_ERROR;
	}